

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.h
# Opt level: O1

void __thiscall LidarMeasurement::~LidarMeasurement(LidarMeasurement *this)

{
  (this->super_Measurement)._vptr_Measurement = (_func_int **)&PTR___cxa_pure_virtual_0014fb80;
  free((this->super_Measurement).ground_truth_.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((this->super_Measurement).estimate_.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((this->super_Measurement).measurements_.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  operator_delete(this);
  return;
}

Assistant:

virtual ~LidarMeasurement() {}